

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::tri_edge_2d
          (tetgenmesh *this,point A,point B,point C,point P,point Q,point R,int level,int *types,
          int *pos)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  point pdVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  point pdVar10;
  point pdVar11;
  bool bVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int local_ac;
  bool local_a0;
  point local_98;
  undefined1 local_68 [16];
  double local_58;
  double abovept [3];
  
  if (R == (point)0x0) {
    facenormal(this,A,B,C,(double *)local_68,1,(double *)0x0);
    dVar17 = SQRT(local_58 * local_58 +
                  local_68._0_8_ * local_68._0_8_ + local_68._8_8_ * local_68._8_8_);
    if ((dVar17 == 0.0) && (!NAN(dVar17))) {
      return 0;
    }
    local_58 = local_58 / dVar17;
    auVar1._8_8_ = dVar17;
    auVar1._0_8_ = dVar17;
    local_68 = divpd(local_68,auVar1);
    dVar17 = distance(this,A,B);
    dVar14 = distance(this,B,C);
    dVar15 = distance(this,C,A);
    dVar17 = (dVar15 + dVar14 + dVar17) / 3.0;
    abovept[0] = dVar17 * (double)local_68._0_8_ + *A;
    abovept[1] = dVar17 * (double)local_68._8_8_ + A[1];
    R = abovept;
    abovept[2] = dVar17 * local_58 + A[2];
  }
  dVar17 = orient3d(P,Q,R,A);
  dVar14 = orient3d(P,Q,R,B);
  dVar15 = orient3d(P,Q,R,C);
  uVar9 = 2;
  pdVar6 = Q;
  pdVar7 = Q;
  pdVar11 = C;
  pdVar10 = B;
  local_98 = P;
  if (0.0 <= dVar17) {
    uVar13 = 1;
    if (dVar17 <= 0.0) {
      if (0.0 <= dVar14) {
        if (0.0 < dVar14) {
          if (0.0 <= dVar15) {
            bVar2 = 0.0 < dVar15;
            uVar13 = (uint)bVar2;
            pdVar11 = B;
            pdVar10 = A;
            pdVar6 = C;
            if (0.0 < dVar15) {
              pdVar11 = A;
              pdVar10 = C;
              pdVar7 = P;
              pdVar6 = B;
              local_98 = Q;
            }
            A = pdVar6;
            uVar9 = (uint)(dVar15 <= 0.0);
            local_ac = 2 - (uint)bVar2;
            uVar5 = uVar9;
            goto LAB_00115b31;
          }
          uVar9 = 2;
          local_ac = 0;
          uVar8 = 0;
          uVar4 = 1;
          uVar13 = 1;
          pdVar10 = P;
          pdVar6 = C;
          pdVar11 = B;
          C = A;
          local_98 = Q;
          goto LAB_001159a1;
        }
        uVar9 = 2;
        bVar2 = 0.0 <= dVar15;
        if (!bVar2) {
          pdVar7 = P;
          local_98 = Q;
        }
        local_a0 = !bVar2 || 0.0 < dVar15;
        uVar13 = (uint)!bVar2;
        uVar4 = 1;
        uVar8 = (uint)bVar2;
        local_ac = 0;
        bVar12 = false;
        bVar2 = false;
        bVar3 = false;
      }
      else {
        if (dVar15 < 0.0) {
          uVar4 = 2;
          uVar9 = 0;
          local_ac = 1;
          uVar8 = 1;
          uVar13 = 0;
          pdVar10 = A;
          C = B;
LAB_001157cd:
          bVar12 = true;
          bVar2 = false;
          P = pdVar6;
          B = pdVar10;
          A = pdVar11;
          goto LAB_001157d5;
        }
        bVar2 = dVar15 <= 0.0;
        uVar13 = (uint)bVar2;
        bVar3 = 0.0 < dVar15;
        uVar4 = (uint)bVar3;
        pdVar6 = A;
        if (dVar15 <= 0.0) {
          pdVar11 = B;
          pdVar6 = C;
          pdVar7 = P;
          pdVar10 = A;
          local_98 = Q;
        }
        A = pdVar6;
        uVar9 = bVar3 + 1;
        local_ac = (uint)bVar2 * 2;
        bVar12 = false;
        uVar5 = (uint)bVar2;
        uVar8 = uVar4;
LAB_00115b33:
        local_a0 = SUB41(uVar5,0);
        bVar2 = false;
      }
    }
    else {
      if (0.0 <= dVar14) {
        if (dVar14 <= 0.0) {
          if (0.0 <= dVar15) {
            bVar2 = dVar15 <= 0.0;
            uVar9 = (uint)(0.0 < dVar15);
            pdVar11 = A;
            pdVar6 = B;
            pdVar10 = C;
            if (0.0 < dVar15) {
              pdVar11 = B;
              pdVar6 = C;
              pdVar7 = P;
              pdVar10 = A;
              local_98 = Q;
            }
            A = pdVar6;
            local_ac = (0.0 < dVar15) + 1;
            uVar13 = uVar9;
            uVar5 = (uint)bVar2;
LAB_00115b31:
            bVar12 = 0.0 < dVar15;
            uVar4 = (uint)bVar2 * 2;
            bVar3 = false;
            uVar8 = uVar5;
            goto LAB_00115b33;
          }
          uVar4 = 2;
          uVar9 = 0;
          local_ac = 1;
          uVar8 = 1;
          uVar13 = 0;
          pdVar10 = Q;
          pdVar6 = A;
          pdVar11 = C;
          C = B;
LAB_001159a1:
          A = pdVar11;
          B = pdVar6;
          P = pdVar10;
          bVar3 = true;
          bVar12 = false;
          bVar2 = false;
          goto LAB_001157d8;
        }
        if (0.0 <= dVar15) {
          if (0.0 < dVar15) {
            return 0;
          }
          local_ac = 0;
          uVar8 = 0;
          pdVar6 = P;
          pdVar10 = C;
          pdVar11 = B;
          C = A;
          local_98 = Q;
          uVar4 = uVar13;
          goto LAB_001157cd;
        }
        uVar9 = 2;
        local_ac = 0;
        uVar8 = 0;
        uVar4 = 1;
        uVar13 = 1;
        pdVar6 = P;
        pdVar10 = C;
        pdVar11 = B;
        C = A;
        local_98 = Q;
      }
      else {
        if (0.0 <= dVar15) {
          bVar2 = 0.0 < dVar15;
          bVar3 = dVar15 <= 0.0;
          local_ac = 2;
          uVar4 = 0;
          uVar8 = 0;
          uVar9 = 1;
          uVar13 = 1;
          bVar12 = false;
          local_98 = Q;
          goto LAB_001157d8;
        }
        uVar4 = 2;
        uVar9 = 0;
        local_ac = 1;
        uVar8 = 1;
        uVar13 = 0;
        pdVar10 = A;
        C = B;
      }
LAB_0011577f:
      bVar2 = true;
      bVar12 = false;
      P = pdVar6;
      B = pdVar10;
      A = pdVar11;
LAB_001157d5:
      bVar3 = false;
LAB_001157d8:
      local_a0 = false;
      pdVar7 = P;
      pdVar11 = B;
      pdVar10 = A;
      A = C;
    }
  }
  else if (0.0 <= dVar14) {
    if (0.0 < dVar14) {
      if (dVar15 < 0.0) {
        local_ac = 2;
        uVar4 = 0;
        uVar9 = 1;
        uVar8 = 1;
        uVar13 = 0;
        pdVar11 = A;
        goto LAB_0011577f;
      }
      bVar2 = 0.0 < dVar15;
      uVar13 = (uint)bVar2;
      pdVar6 = Q;
      if (0.0 < dVar15) {
        pdVar10 = A;
        A = C;
        pdVar6 = P;
        C = B;
        local_98 = Q;
      }
      P = pdVar6;
      B = pdVar10;
      bVar3 = dVar15 <= 0.0;
      uVar8 = (uint)bVar3;
      uVar4 = (uint)bVar2 * 2;
      local_ac = 2 - (uint)bVar2;
      bVar12 = false;
      uVar9 = uVar8;
      goto LAB_001157d8;
    }
    if (dVar15 < 0.0) {
      local_ac = 2;
      uVar9 = 1;
      uVar8 = 1;
      uVar13 = 0;
      pdVar11 = A;
      uVar4 = 0;
      goto LAB_001157cd;
    }
    bVar3 = 0.0 < dVar15;
    local_a0 = dVar15 <= 0.0;
    uVar4 = 2;
    uVar9 = 0;
    uVar8 = 0;
    local_ac = 1;
    uVar13 = 1;
    bVar12 = false;
    bVar2 = false;
    pdVar7 = P;
    pdVar11 = A;
    pdVar10 = C;
    A = B;
    local_98 = Q;
  }
  else {
    uVar9 = 2;
    if (dVar15 < 0.0) {
      return 0;
    }
    bVar2 = 0.0 < dVar15;
    bVar12 = dVar15 <= 0.0;
    local_ac = 0;
    uVar4 = 1;
    uVar8 = 1;
    uVar13 = 0;
    bVar3 = false;
    local_a0 = false;
  }
  dVar17 = orient3d(A,pdVar11,R,pdVar7);
  dVar14 = orient3d(pdVar10,pdVar11,R,local_98);
  if (0.0 < dVar17) {
    return 0;
  }
  if (dVar14 < 0.0) {
    return 0;
  }
  if (level == 0) {
    return 1;
  }
  if (bVar12) {
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        *types = 7;
      }
      else {
        *types = 2;
      }
      *pos = uVar9;
    }
    else {
      *types = 2;
      *pos = uVar9;
      uVar13 = uVar8;
    }
    pos[1] = uVar13;
    types[1] = 0;
    return 4;
  }
  dVar15 = orient3d(A,pdVar11,R,local_98);
  dVar16 = orient3d(pdVar10,pdVar11,R,pdVar7);
  if (bVar2) {
    if (0.0 <= dVar17) {
      *types = 5;
      *pos = uVar9;
      pos[1] = uVar8;
      types[1] = 0;
      return 4;
    }
    if (dVar15 <= 0.0) {
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        if (dVar14 <= 0.0) {
          *types = 5;
          *pos = uVar4;
          pos[1] = uVar13;
          goto LAB_00115e05;
        }
        if (0.0 < dVar16) {
          *types = 6;
          *pos = 3;
          pos[1] = uVar13;
          types[1] = 6;
          pos[2] = 3;
          goto LAB_00115fbb;
        }
        *types = 6;
        *pos = 3;
        goto LAB_00115ef7;
      }
      if (dVar16 <= 0.0) {
        *types = 5;
        goto LAB_00115ef0;
      }
      *types = 5;
    }
    else {
      if (dVar16 <= 0.0) {
        *types = 8;
LAB_00115ef0:
        *pos = uVar9;
LAB_00115ef7:
        pos[1] = uVar13;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          types[1] = 8;
          pos[2] = uVar4;
          pos[3] = uVar13;
          return 4;
        }
LAB_00115fb1:
        types[1] = 5;
        pos[2] = uVar4;
        goto LAB_00115fbb;
      }
      *types = 8;
    }
    *pos = uVar9;
    pos[1] = uVar13;
  }
  else {
    if (!bVar3) {
      if (local_a0 == false) {
        return 4;
      }
      if (0.0 <= dVar17) {
        *types = 2;
        *pos = local_ac;
        pos[1] = uVar8;
LAB_00115eab:
        types[1] = 0;
        return 4;
      }
      if (0.0 < dVar15) {
        if (dVar16 <= 0.0) {
          *types = 7;
LAB_00115fed:
          *pos = local_ac;
          pos[1] = uVar13;
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
LAB_001160e1:
            types[1] = 7;
            pos[2] = uVar4;
            pos[3] = uVar13;
            return 4;
          }
          types[1] = 2;
          pos[2] = uVar4;
          goto LAB_00116018;
        }
        *types = 7;
LAB_00115f44:
        *pos = local_ac;
        pos[1] = uVar13;
        types[1] = 5;
      }
      else {
        if ((dVar15 == 0.0) && (!NAN(dVar15))) {
          if (dVar16 <= 0.0) {
            if ((dVar16 == 0.0) && (!NAN(dVar16))) {
              *types = 3;
              *pos = local_ac;
              pos[1] = uVar13;
              goto LAB_00115eab;
            }
            *types = 2;
            *pos = local_ac;
            pos[1] = uVar13;
            goto LAB_001160e1;
          }
          *types = 2;
          goto LAB_00115f44;
        }
        if (dVar14 <= 0.0) {
          *types = 2;
          *pos = uVar4;
          pos[1] = uVar13;
          goto LAB_00115eab;
        }
        if (dVar16 <= 0.0) {
          *types = 5;
          goto LAB_00115fed;
        }
        *types = 5;
        *pos = local_ac;
        pos[1] = uVar13;
        types[1] = 5;
      }
      pos[2] = local_ac;
LAB_00116018:
      pos[3] = uVar8;
      return 4;
    }
    if (0.0 <= dVar17) {
      *types = 2;
      *pos = local_ac;
      pos[1] = uVar8;
LAB_00115e05:
      types[1] = 0;
      return 4;
    }
    if (dVar15 <= 0.0) {
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        if (0.0 < dVar14) {
          if (dVar16 <= 0.0) {
            if ((dVar16 != 0.0) || (NAN(dVar16))) {
              *types = 8;
              *pos = uVar4;
              pos[1] = uVar13;
              return 4;
            }
            *types = 5;
            *pos = uVar4;
          }
          else {
            *types = 6;
            *pos = 3;
          }
          pos[1] = uVar8;
          return 4;
        }
        *types = 5;
        *pos = uVar4;
        pos[1] = uVar13;
        goto LAB_00115e05;
      }
      if (0.0 < dVar16) {
        *types = 2;
        goto LAB_00115e77;
      }
      *types = 2;
LAB_00115fa8:
      *pos = local_ac;
      pos[1] = uVar13;
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        types[1] = 8;
        pos[2] = uVar4;
        pos[3] = uVar13;
        return 4;
      }
      goto LAB_00115fb1;
    }
    if (dVar16 <= 0.0) {
      *types = 7;
      goto LAB_00115fa8;
    }
    *types = 7;
LAB_00115e77:
    *pos = local_ac;
    pos[1] = uVar13;
  }
  types[1] = 6;
  pos[2] = 3;
LAB_00115fbb:
  pos[3] = uVar8;
  return 4;
}

Assistant:

int tetgenmesh::tri_edge_2d(point A, point B, point C, point P, point Q, 
                            point R, int level, int *types, int *pos)
{
  point U[3], V[3];  // The permuted vectors of points.
  int pu[3], pv[3];  // The original positions of points.
  REAL abovept[3];
  REAL sA, sB, sC;
  REAL s1, s2, s3, s4;
  int z1;

  if (R == NULL) {
    // Calculate a lift point.
    if (1) {
      REAL n[3], len;
      // Calculate a lift point, saved in dummypoint.
      facenormal(A, B, C, n, 1, NULL);
      len = sqrt(dot(n, n));
      if (len != 0) {
        n[0] /= len;
        n[1] /= len;
        n[2] /= len;
        len = distance(A, B);
        len += distance(B, C);
        len += distance(C, A);
        len /= 3.0;
        R = abovept; //dummypoint;
        R[0] = A[0] + len * n[0];
        R[1] = A[1] + len * n[1];
        R[2] = A[2] + len * n[2];
      } else {
        // The triangle [A,B,C] is (nearly) degenerate, i.e., it is (close)
        //   to a line.  We need a line-line intersection test.
        // !!! A non-save return value.!!!
        return 0;  // DISJOINT
      }
    }
  }

  // Test A's, B's, and C's orientations wrt plane PQR. 
  sA = orient3d(P, Q, R, A);
  sB = orient3d(P, Q, R, B);
  sC = orient3d(P, Q, R, C);


  if (sA < 0) {
    if (sB < 0) {
      if (sC < 0) { // (---).
        return 0; 
      } else {
        if (sC > 0) { // (--+).
          // All points are in the right positions.
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else { // (--0).
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        }
      }
    } else { 
      if (sB > 0) {
        if (sC < 0) { // (-+-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (-++).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (-+0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          }
        }
      } else {
        if (sC < 0) { // (-0-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (-0+).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else { // (-00).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      }
    }
  } else {
    if (sA > 0) {
      if (sB < 0) {
        if (sC < 0) { // (+--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (+-+).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (+-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (++-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else {
            if (sC > 0) { // (+++).
              return 0; 
            } else { // (++0).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1; 
            }
          }
        } else { // (+0#)
          if (sC < 0) { // (+0-).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (+0+).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (+00).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        }
      }
    } else { 
      if (sB < 0) {
        if (sC < 0) { // (0--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (0-+).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else { // (0-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (0+-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (0++).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (0+0).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        } else { // (00#)
          if (sC < 0) { // (00-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          } else {
            if (sC > 0) { // (00+).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            } else { // (000)
              // Not possible unless ABC is degenerate.
              // Avoiding compiler warnings.
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 4;
            }
          }
        }
      }
    }
  }

  s1 = orient3d(U[0], U[2], R, V[1]);  // A, C, R, Q
  s2 = orient3d(U[1], U[2], R, V[0]);  // B, C, R, P

  if (s1 > 0) {
    return 0;
  }
  if (s2 < 0) {
    return 0;
  }

  if (level == 0) {
    return 1;  // They are intersected.
  }


  if (z1 == 1) {
    if (s1 == 0) {  // (0###)
      // C = Q.
      types[0] = (int) SHAREVERT;
      pos[0] = pu[2]; // C
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    } else {
      if (s2 == 0) { // (#0##)
        // C = P.
        types[0] = (int) SHAREVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // P
        types[1] = (int) DISJOINT;
      } else { // (-+##)
        // C in [P, Q].
        types[0] = (int) ACROSSVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // [P, Q]
        types[1] = (int) DISJOINT;
      }
    }
    return 4;
  }

  s3 = orient3d(U[0], U[2], R, V[0]);  // A, C, R, P
  s4 = orient3d(U[1], U[2], R, V[1]);  // B, C, R, Q
      
  if (z1 == 0) {  // (tritri-03)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [k, l] (-+++).
          types[0] = (int) ACROSSEDGE;
          pos[0] = pu[2]; // [C, A]
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [k, l] (-++0).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [k, l] (-++-).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = k, [P, Q] in [k, l] (-+0+).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [k, l] (-+00).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else {
              // P = k, [P, Q] contains [k, l] (-+0-).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [k, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHFACE;
              pos[2] = 3;     // [A, B, C]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [k, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) TOUCHEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [k, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = k (0####)
      types[0] = (int) TOUCHEDGE;
      pos[0] = pu[2]; // [C, A]
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 2) {  // (tritri-23)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, l] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [A, l] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, l] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, l] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, l] (-+00).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else { // s4 < 0
              // Q = l, [P, Q] in [A, l] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [A, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) ACROSSEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 3) {  // (tritri-33)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, B] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHEDGE;
          pos[2] = pu[0]; // [A, B]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = B, [P, Q] contains [A, B] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) SHAREVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, B] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, B] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[0]; // [A, B]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, B] (-+00).
              types[0] = (int) SHAREEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // [P, Q]
              types[1] = (int) DISJOINT;
            } else { // s4 < 0
              // P= A, [P, Q] in [A, B] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSVERT;
              pos[2] = pu[1]; // B
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, B] (-+-+).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[0]; // [A, B]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = B, [P, Q] in [A, B] (-+-0).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) SHAREVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, B] (-+--).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = B (#0##).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[1]; // B
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  }

  return 4;
}